

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_codecvt.h
# Opt level: O3

result __thiscall
booster::locale::generic_codecvt<wchar_t,_booster::locale::utf8_codecvt<wchar_t>,_4>::do_out
          (generic_codecvt<wchar_t,_booster::locale::utf8_codecvt<wchar_t>,_4> *this,
          mbstate_t *param_1,uchar *from,uchar *from_end,uchar **from_next,char *to,char *to_end,
          char **to_next)

{
  uint u;
  code_point cVar1;
  result rVar2;
  state_type local_39;
  uchar **local_38;
  
  local_38 = from_next;
  if (from < from_end && to < to_end) {
    rVar2 = error;
    do {
      u = *from;
      if ((0x10ffff < u) || ((u & 0x1ff800) == 0xd800)) {
LAB_0017c9ce:
        *local_38 = from;
        *to_next = to;
        return rVar2;
      }
      cVar1 = utf8_codecvt<wchar_t>::from_unicode(&local_39,u,to,to_end);
      if (cVar1 == 0xfffffffe) {
        rVar2 = partial;
        goto LAB_0017c9ce;
      }
      if (cVar1 == 0xffffffff) goto LAB_0017c9ce;
      to = to + cVar1;
      from = (uchar *)((uint *)from + 1);
    } while ((to < to_end) && (from < from_end));
  }
  *local_38 = from;
  *to_next = to;
  return (uint)(from != from_end);
}

Assistant:

virtual std::codecvt_base::result 
    do_out( std::mbstate_t &/*std_state*/,
            uchar const *from,
            uchar const *from_end,
            uchar const *&from_next,
            char *to,
            char *to_end,
            char *&to_next) const
    {
        std::codecvt_base::result r=std::codecvt_base::ok;
        typedef typename CodecvtImpl::state_type state_type;
        state_type cvt_state = implementation().initial_state(generic_codecvt_base::from_unicode_state);
        while(to < to_end && from < from_end)
        {
#ifdef DEBUG_CODECVT            
        std::cout << "Entering OUT --------------" << std::endl;
        std::cout << "State " << std::hex << state <<std::endl;
        std::cout << "Left in " << std::dec << from_end - from << " out " << to_end -to << std::endl;
#endif            
            booster::uint32_t ch=0;
            ch = *from;
            if(!booster::locale::utf::is_valid_codepoint(ch)) {
                r=std::codecvt_base::error;
                break;
            }
            booster::uint32_t len = implementation().from_unicode(cvt_state,ch,to,to_end);
            if(len == booster::locale::utf::incomplete) {
                r=std::codecvt_base::partial;
                break;
            }
            else if(len == booster::locale::utf::illegal) {
                r=std::codecvt_base::error;
                break;
            }
            to+=len;
            from++;
        }
        from_next=from;
        to_next=to;
        if(r==std::codecvt_base::ok && from!=from_end)
            r = std::codecvt_base::partial;
#ifdef DEBUG_CODECVT            
        std::cout << "Returning ";
        switch(r) {
        case std::codecvt_base::ok:
            std::cout << "ok" << std::endl;
            break;
        case std::codecvt_base::partial:
            std::cout << "partial" << std::endl;
            break;
        case std::codecvt_base::error:
            std::cout << "error" << std::endl;
            break;
        default:
            std::cout << "other" << std::endl;
            break;
        }
        std::cout << "State " << std::hex << state <<std::endl;
        std::cout << "Left in " << std::dec << from_end - from << " out " << to_end -to << std::endl;
#endif            
        return r;
    }